

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

bool testExtendAndPrepend<CyclicHash<unsigned_long_long,unsigned_char>>(uint L)

{
  ostream *poVar1;
  byte bVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  string extend;
  string prepend;
  string base;
  string input;
  CyclicHash<unsigned_long_long,_unsigned_char> hf;
  char *local_8d8;
  ulong local_8d0;
  char local_8c8 [16];
  char *local_8b8;
  ulong local_8b0;
  char local_8a8 [16];
  char *local_898;
  ulong local_890;
  char local_888 [16];
  byte *local_878;
  long local_870;
  byte local_868 [16];
  CyclicHash<unsigned_long_long,_unsigned_char> local_858;
  
  CyclicHash<unsigned_long_long,_unsigned_char>::CyclicHash(&local_858,4,L);
  local_878 = local_868;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_878,"XABCDY","");
  local_898 = local_888;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_898,local_878 + 1,local_878 + local_870 + -1);
  if (local_890 != 4) {
    __assert_fail("base.size() == n",
                  "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                  ,0x11,
                  "bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<unsigned long long>]")
    ;
  }
  local_8d8 = local_8c8;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_8d8,local_878 + 1,local_878 + local_870);
  local_8b8 = local_8a8;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)&local_8b8,local_878,local_878 + local_870 + -1);
  if (local_890 == 0) {
LAB_00105206:
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      local_858.hashvalue =
           (local_858.hashvalue >> ((char)local_858.wordsize - 1U & 0x3f) |
           (local_858.mask1 & local_858.hashvalue) * 2) ^
           local_858.hasher.hashvalues[(byte)local_898[uVar3]];
      uVar3 = uVar3 + 1;
    } while (local_890 != uVar3);
    if (local_890 == 0) goto LAB_00105206;
    uVar6 = 0;
    uVar3 = 0;
    do {
      uVar3 = (uVar3 >> ((char)local_858.wordsize - 1U & 0x3f) | (uVar3 & local_858.mask1) * 2) ^
              local_858.hasher.hashvalues[(uint)(int)local_898[uVar6]];
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) < local_890);
  }
  if (local_858.hashvalue == uVar3) {
    uVar3 = local_858.hasher.hashvalues[*local_878];
    uVar3 = (uVar3 >> ((char)local_858.wordsize - (byte)local_858.myr & 0x3f) |
            (local_858.maskn & uVar3) << ((byte)local_858.myr & 0x3f)) ^ local_858.hashvalue;
    if (local_8b0 == 0) {
      uVar6 = 0;
    }
    else {
      uVar7 = 0;
      uVar6 = 0;
      do {
        uVar6 = (uVar6 >> ((char)local_858.wordsize - 1U & 0x3f) | (uVar6 & local_858.mask1) * 2) ^
                local_858.hasher.hashvalues[(uint)(int)local_8b8[uVar7]];
        uVar7 = uVar7 + 1;
      } while ((uVar7 & 0xffffffff) < local_8b0);
    }
    if (uVar3 == uVar6) {
      bVar2 = (char)local_858.wordsize - 1;
      uVar6 = (local_858.hashvalue >> (bVar2 & 0x3f) | (local_858.mask1 & local_858.hashvalue) * 2)
              ^ local_858.hasher.hashvalues[local_878[local_870 + -1]];
      if (local_8d0 == 0) {
        uVar7 = 0;
      }
      else {
        uVar8 = 0;
        uVar7 = 0;
        do {
          uVar7 = (uVar7 >> (bVar2 & 0x3f) | (uVar7 & local_858.mask1) * 2) ^
                  local_858.hasher.hashvalues[(uint)(int)local_8d8[uVar8]];
          uVar8 = uVar8 + 1;
        } while ((uVar8 & 0xffffffff) < local_8d0);
      }
      if (uVar6 == uVar7) {
        if (local_890 == 0) {
          uVar7 = 0;
        }
        else {
          uVar8 = 0;
          uVar7 = 0;
          do {
            uVar7 = (uVar7 >> (bVar2 & 0x3f) | (uVar7 & local_858.mask1) * 2) ^
                    local_858.hasher.hashvalues[(uint)(int)local_898[uVar8]];
            uVar8 = uVar8 + 1;
          } while ((uVar8 & 0xffffffff) < local_890);
        }
        if (local_858.hashvalue != uVar7) {
          __assert_fail("hf.hashvalue == hf.hash(base)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2a,
                        "bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<unsigned long long>]"
                       );
        }
        if (local_8b0 == 0) {
          uVar7 = 0;
        }
        else {
          uVar8 = 0;
          uVar7 = 0;
          do {
            uVar7 = (uVar7 >> (bVar2 & 0x3f) | (uVar7 & local_858.mask1) * 2) ^
                    local_858.hasher.hashvalues[(uint)(int)local_8b8[uVar8]];
            uVar8 = uVar8 + 1;
          } while ((uVar8 & 0xffffffff) < local_8b0);
        }
        if (uVar3 != uVar7) {
          __assert_fail("hf.hash_prepend(input[0]) == hf.hash(prepend)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2b,
                        "bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<unsigned long long>]"
                       );
        }
        if (local_8d0 == 0) {
          uVar3 = 0;
        }
        else {
          uVar7 = 0;
          uVar3 = 0;
          do {
            uVar3 = (uVar3 >> (bVar2 & 0x3f) | (uVar3 & local_858.mask1) * 2) ^
                    local_858.hasher.hashvalues[(uint)(int)local_8d8[uVar7]];
            uVar7 = uVar7 + 1;
          } while ((uVar7 & 0xffffffff) < local_8d0);
        }
        bVar4 = true;
        if (uVar6 != uVar3) {
          __assert_fail("hf.hash_extend(input.back()) == hf.hash(extend)",
                        "/workspace/llm4binary/github/license_c_cmakelists/lemire[P]rollinghashcpp/tests/unit.cpp"
                        ,0x2c,
                        "bool testExtendAndPrepend(uint) [hashfunction = CyclicHash<unsigned long long>]"
                       );
        }
        goto LAB_001057eb;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bug!",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_8d8,local_8d0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      if (local_8d0 != 0) {
        uVar5 = 0;
        do {
          uVar5 = uVar5 + 1;
        } while (uVar5 < local_8d0);
      }
      poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bug!",4);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_8b8,local_8b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      if (local_8b0 != 0) {
        uVar5 = 0;
        do {
          uVar5 = uVar5 + 1;
        } while (uVar5 < local_8b0);
      }
      poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bug!",4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_898,local_890);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
    if (local_890 != 0) {
      uVar5 = 0;
      do {
        uVar5 = uVar5 + 1;
      } while (uVar5 < local_890);
    }
    poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  }
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  bVar4 = false;
LAB_001057eb:
  if (local_8b8 != local_8a8) {
    operator_delete(local_8b8);
  }
  if (local_8d8 != local_8c8) {
    operator_delete(local_8d8);
  }
  if (local_898 != local_888) {
    operator_delete(local_898);
  }
  if (local_878 != local_868) {
    operator_delete(local_878);
  }
  return bVar4;
}

Assistant:

bool testExtendAndPrepend(uint L = 19) {
  const uint n(4); // n-grams
  hashfunction hf(n, L);
  string input = "XABCDY";
  string base(input.begin() + 1, input.end() - 1);
  assert(base.size() == n);
  string extend(input.begin() + 1, input.end());
  string prepend(input.begin(), input.end() - 1);

  for (string::const_iterator j = base.begin(); j != base.end(); ++j) {
    hf.eat(*j);
  }
  if (hf.hashvalue != hf.hash(base)) {
    std::cout << "bug!" << std::endl;
    std::cout << base << " " << hf.hash(base) << std::endl;
    return false;
  }
  if (hf.hash_prepend(input[0]) != hf.hash(prepend)) {
    std::cout << "bug!" << std::endl;
    std::cout << prepend << " " << hf.hash_prepend(input[0]) << " "
              << hf.hash(prepend) << std::endl;
    return false;
  }
  if (hf.hash_extend(input.back()) != hf.hash(extend)) {
    std::cout << "bug!" << std::endl;
    std::cout << extend << " " << hf.hash_extend(input.back()) << " "
              << hf.hash(extend) << std::endl;
    return false;
  }

  assert(hf.hashvalue == hf.hash(base));
  assert(hf.hash_prepend(input[0]) == hf.hash(prepend));
  assert(hf.hash_extend(input.back()) == hf.hash(extend));

  return true;
}